

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

http_request_line * parse_request_line(http_request_line *__return_storage_ptr__,sub_string *text)

{
  sub_string *psVar1;
  bool bVar2;
  http_request_method hVar3;
  http_version hVar4;
  char *pcVar5;
  char *pcVar6;
  http_parsing_error *phVar7;
  sub_string other;
  sub_string local_60;
  char local_49;
  char *local_48;
  char *i;
  sub_string local_30;
  sub_string local_20;
  sub_string *local_10;
  sub_string *text_local;
  
  local_10 = text;
  do {
    psVar1 = local_10;
    local_20 = sub_string::literal<3ul>((char (*) [3])0x1873c6);
    bVar2 = sub_string::try_drop_prefix(psVar1,local_20);
  } while (bVar2);
  http_request_line::http_request_line(__return_storage_ptr__);
  hVar3 = parse_request_method(local_10);
  psVar1 = local_10;
  __return_storage_ptr__->method = hVar3;
  local_30 = sub_string::literal<2ul>((char (*) [2])0x18b22a);
  bVar2 = sub_string::try_drop_prefix(psVar1,local_30);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid request line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar5 = sub_string::begin(local_10);
  pcVar6 = sub_string::end(local_10);
  local_49 = ' ';
  pcVar5 = std::find<char_const*,char>(pcVar5,pcVar6,&local_49);
  local_48 = pcVar5;
  pcVar6 = sub_string::end(local_10);
  if (pcVar5 == pcVar6) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid request line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar5 = sub_string::begin(local_10);
  sub_string::sub_string(&local_60,pcVar5,local_48);
  (__return_storage_ptr__->uri).begin_ = local_60.begin_;
  (__return_storage_ptr__->uri).end_ = local_60.end_;
  local_48 = local_48 + 1;
  sub_string::begin(local_10,local_48);
  hVar4 = parse_version(local_10);
  psVar1 = local_10;
  __return_storage_ptr__->version = hVar4;
  other = sub_string::literal<3ul>((char (*) [3])0x1873c6);
  bVar2 = sub_string::try_drop_prefix(psVar1,other);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    phVar7 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar7,"invalid request line");
    __cxa_throw(phVar7,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  return __return_storage_ptr__;
}

Assistant:

http_request_line parse_request_line(sub_string& text)
{
    // rfc2616 [4.1]
    // In the interest of robustness, servers SHOULD ignore any empty line(s)
    // received where a Request-Line is expected. In other words, if the
    // server is reading the protocol stream at the beginning of a message and
    // receives a CRLF first, it should ignore the CRLF.

    while (text.try_drop_prefix(sub_string::literal("\r\n")));

    // rfc2616 [5.1]
    // Request-Line   = Method SP Request-URI SP HTTP-Version CRLF
    http_request_line result;
    result.method = parse_request_method(text);

    if (!text.try_drop_prefix(sub_string::literal(" ")))
        throw http_parsing_error("invalid request line");

    auto i = std::find(text.begin(), text.end(), ' ');
    if (i == text.end())
        throw http_parsing_error("invalid request line");

    result.uri = sub_string{text.begin(), i};
    ++i;

    text.begin(i);

    result.version = parse_version(text);

    if (!text.try_drop_prefix(sub_string::literal("\r\n")))
        throw http_parsing_error("invalid request line");

    return result;
}